

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Foo::save<miyuki::serialize::OutputArchive>(Foo *this,OutputArchive *ar)

{
  miyuki::refl::
  accept<miyuki::serialize::AutoSaveVisitor,24ul,int,int,int,std::shared_ptr<Bar>,std::shared_ptr<Bar>,std::vector<std::shared_ptr<Bar>,std::allocator<std::shared_ptr<Bar>>>>
            ((AutoSaveVisitor)ar,(char (*) [24])"a, b, c, bar, bar2, vec",&this->a,&this->b,&this->c
             ,&this->bar,&this->bar2,&this->vec);
  return;
}

Assistant:

int main() {
    Context context;
    context.registerType<Bar>();
    Foo foo{};
    foo.a = 2;
    foo.b = 3;
    foo.c = 4;

    foo.bar = std::make_shared<Bar>();
    foo.bar2 = foo.bar;
    for(int i =0;i<3;i++){
        foo.vec.push_back(foo.bar);
    }
    auto j = toJson(context, foo);
    std::cout << j.dump() << std::endl;
    j = json::json::parse(R"({"a":2,"b":3,"bar":{"addr":"8994096","props":{"a":0,"b":0,"c":4}},"bar2":{"addr":"8994096","type":"Bar"},"c":4,"vec":[{"addr":"8994096","type":"Bar"},{"addr":"8994096","type":"Bar"},{"addr":"8994096","type":"Bar"}]})");

    foo = fromJson<Foo>(context, j);

    std::cout << j.dump() << std::endl;
}